

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

bool __thiscall table::insertcheck(table *this,InsertStatement *stmt)

{
  vector<char_*,_std::allocator<char_*>_> *pvVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  Expr *pEVar4;
  char *__s;
  column *pcVar5;
  _Alloc_hider __s_00;
  char cVar6;
  bool bVar7;
  int iVar8;
  column *pcVar9;
  ostream *poVar10;
  string *str2;
  size_t sVar11;
  pointer ppcVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  string local_260;
  fstream os;
  
  pvVar1 = stmt->columns;
  if (pvVar1 == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    if ((long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
LAB_0011618b:
      std::fstream::fstream(&os,(string *)&this->filename,_S_out|_S_in|_S_bin|_S_app);
      cVar6 = std::__basic_file<char>::is_open();
      if (cVar6 == '\0') {
        poVar10 = std::operator<<((ostream *)&std::cout,"cannot open table file");
        std::endl<char,std::char_traits<char>>(poVar10);
LAB_00116531:
        bVar7 = false;
      }
      else {
        pcVar9 = this->primaryKey;
        str2 = &pcVar9->name;
        uVar15 = 0;
        while( true ) {
          ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->table_cols).
                            super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3) <= uVar15)
          break;
          bVar7 = std::operator==(&ppcVar3[uVar15]->flag,"CHAR");
          pEVar4 = (stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar15];
          if (bVar7) {
            if (pEVar4->type == kExprLiteralString) {
              __s = pEVar4->name;
              sVar11 = strlen(__s);
              pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15];
              if ((ulong)(long)pcVar5->element_truesize < sVar11) {
                poVar10 = std::operator<<((ostream *)&std::cout,"Wrong Char size");
                std::endl<char,std::char_traits<char>>(poVar10);
                goto LAB_00116531;
              }
              if ((pcVar9 != (column *)0x0) &&
                 (bVar7 = util::compareString(&pcVar5->name,str2), bVar7)) {
                poVar10 = std::operator<<((ostream *)&std::cout,"check primary key values");
                std::endl<char,std::char_traits<char>>(poVar10);
                iVar14 = 0;
                while (iVar14 < this->rowlength) {
                  std::istream::seekg(&os,(long)(this->table_cols).
                                                super__Vector_base<column_*,_std::allocator<column_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                                col_offset + (long)iVar14 * (long)this->rowSize,0);
                  iVar8 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]->element_truesize;
                  if (iVar8 < 0) {
                    iVar8 = -1;
                  }
                  pcVar13 = (char *)operator_new__((long)iVar8);
                  std::istream::read((char *)&os,(long)pcVar13);
                  bVar7 = util::compareString(pcVar13,__s);
                  iVar14 = iVar14 + 1;
                  if (bVar7) {
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "Can\'t insert duplicate values to primary key column"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar10);
LAB_00116529:
                    operator_delete(pcVar13);
                    goto LAB_00116531;
                  }
                }
              }
            }
            else {
              std::__cxx11::to_string(&local_260,pEVar4->ival);
              __s_00._M_p = local_260._M_dataplus._M_p;
              std::__cxx11::string::~string((string *)&local_260);
              sVar11 = strlen(__s_00._M_p);
              pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15];
              if ((ulong)(long)pcVar5->element_truesize < sVar11) {
                poVar10 = std::operator<<((ostream *)&std::cout,"Wrong Char size");
                std::endl<char,std::char_traits<char>>(poVar10);
                goto LAB_00116531;
              }
              if ((pcVar9 != (column *)0x0) &&
                 (bVar7 = util::compareString(&pcVar5->name,str2), bVar7)) {
                iVar14 = 0;
                while (iVar14 < this->rowlength) {
                  std::istream::seekg(&os,(long)(this->table_cols).
                                                super__Vector_base<column_*,_std::allocator<column_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                                col_offset + (long)iVar14 * (long)this->rowSize,0);
                  iVar8 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]->element_truesize;
                  if (iVar8 < 0) {
                    iVar8 = -1;
                  }
                  pcVar13 = (char *)operator_new__((long)iVar8);
                  std::istream::read((char *)&os,(long)pcVar13);
                  bVar7 = util::compareString(pcVar13,__s_00._M_p);
                  iVar14 = iVar14 + 1;
                  if (bVar7) {
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "Can\'t insert duplicate values to primary key column"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar10);
                    goto LAB_00116529;
                  }
                }
              }
            }
          }
          else {
            if (pEVar4->type == kExprLiteralString) {
              poVar10 = std::operator<<((ostream *)&std::cout,"need a int value instead of a string"
                                       );
              std::endl<char,std::char_traits<char>>(poVar10);
              goto LAB_00116531;
            }
            if ((pcVar9 != (column *)0x0) &&
               (bVar7 = util::compareString(&(this->table_cols).
                                             super__Vector_base<column_*,_std::allocator<column_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar15]->name
                                            ,str2), bVar7)) {
              iVar14 = 0;
              while (iVar14 < this->rowlength) {
                std::istream::seekg(&os,(long)(this->table_cols).
                                              super__Vector_base<column_*,_std::allocator<column_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                              col_offset + (long)iVar14 * (long)this->rowSize,0);
                iVar8 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar15]->element_truesize;
                if (iVar8 < 0) {
                  iVar8 = -1;
                }
                pcVar13 = (char *)operator_new__((long)iVar8);
                std::istream::read((char *)&os,(long)pcVar13);
                bVar7 = util::compareString(pcVar13,(char *)&(stmt->values->
                                                                                                                          
                                                  super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar15]
                                                  ->ival);
                iVar14 = iVar14 + 1;
                if (bVar7) {
                  poVar10 = std::operator<<((ostream *)&std::cout,
                                            "Can\'t insert duplicate values to primary key column");
                  std::endl<char,std::char_traits<char>>(poVar10);
                  goto LAB_00116529;
                }
              }
            }
          }
          uVar15 = uVar15 + 1;
        }
        bVar7 = true;
        std::fstream::close();
      }
      std::fstream::~fstream(&os);
      return bVar7;
    }
    poVar10 = (ostream *)&std::cout;
    pcVar13 = "INSERT has different number of columns than target columns";
  }
  else {
    ppcVar12 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppcVar2 - (long)ppcVar12 ==
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      do {
        if (ppcVar12 == ppcVar2) goto LAB_0011618b;
        pcVar13 = *ppcVar12;
        std::__cxx11::string::string((string *)&os,pcVar13,(allocator *)&local_260);
        pcVar9 = getColumn(this,(string *)&os);
        std::__cxx11::string::~string((string *)&os);
        ppcVar12 = ppcVar12 + 1;
      } while (pcVar9 != (column *)0x0);
      poVar10 = std::operator<<((ostream *)&std::cout,"Unknown column ");
      poVar10 = std::operator<<(poVar10,pcVar13);
      pcVar13 = " in table list\'";
    }
    else {
      poVar10 = (ostream *)&std::cout;
      pcVar13 = "Column count doesn\'t match value count";
    }
  }
  poVar10 = std::operator<<(poVar10,pcVar13);
  std::endl<char,std::char_traits<char>>(poVar10);
  return false;
}

Assistant:

bool table::insertcheck(hsql::InsertStatement *stmt) {

    if(stmt->columns != NULL && stmt->columns->size() != stmt->values->size()){
        cout <<"Column count doesn't match value count"<<endl;
        return false;
    }
    if(stmt->columns == NULL && table_cols.size() != stmt->values->size()){
        cout <<"INSERT has different number of columns than target columns"<<endl;
        return false;
    }
    if(stmt->columns != NULL){
        for(char* col_name : *stmt->columns){
            auto it = getColumn(col_name);
            if(it == NULL){
                cout <<"Unknown column "<<col_name<<" in table list'"<<endl;
                return false;
            }
        }
    }
    fstream os(filename, ios::in|ios::out|ios::binary|ios::app);
    if(!os.is_open()){
        cout << "cannot open table file" <<endl;
        return false;
    }

    //check insert type
    column* primary = getPrimaryKey();
    for(int i=0; i < table_cols.size(); i++){

        if(table_cols[i]->flag == "CHAR"){
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                const char* str = (*stmt->values)[i]->name ;
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary != nullptr && util::compareString(table_cols[i]->name, primary->name)){
                    cout << "check primary key values"<<endl;
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }

                    }
                }

            }
            else{
                const char* str = to_string( (*stmt->values)[i]->ival ).c_str();
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary!=nullptr&&util::compareString(table_cols[i]->name, primary->name)){
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }
                    }
                }
            }
        }
        else{
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                cout<<"need a int value instead of a string"<<endl;
                return false;
            }
            if(primary!= nullptr && util::compareString(table_cols[i]->name, primary->name)){
                for(int j=0 ; j < getRowlength(); j++){
                    os.seekg(j * rowSize + table_cols[i]->col_offset);
                    char *bytes = new char[table_cols[i]->element_truesize];
                    os.read(bytes, table_cols[i]->element_truesize);
                    //cout  << bytes <<endl;
                    if(util::compareString(bytes, (char*)&(*stmt->values)[i]->ival)){
                        cout<<"Can't insert duplicate values to primary key column"<<endl;
                        delete bytes;
                        return false;
                    }

                }
            }

        }
    }
    os.close();

    return true;
}